

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

int32_t __thiscall
wasm::WasmBinaryWriter::startSection<wasm::BinaryConsts::Section>
          (WasmBinaryWriter *this,Section code)

{
  int32_t iVar1;
  size_type sVar2;
  size_type sVar3;
  Section code_local;
  WasmBinaryWriter *this_local;
  
  BufferWithRandomAccess::operator<<(this->o,(uint8_t)code);
  if (this->sourceMap != (ostream *)0x0) {
    sVar2 = std::
            vector<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>,_std::allocator<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>_>_>
            ::size(&this->sourceMapLocations);
    this->sourceMapLocationsSizeAtSectionStart = sVar2;
  }
  sVar3 = std::
          unordered_map<wasm::Expression_*,_wasm::BinaryLocations::Span,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>_>
          ::size(&(this->binaryLocations).expressions);
  this->binaryLocationsSizeAtSectionStart = sVar3;
  iVar1 = writeU32LEBPlaceholder(this);
  return iVar1;
}

Assistant:

int32_t WasmBinaryWriter::startSection(T code) {
  o << uint8_t(code);
  if (sourceMap) {
    sourceMapLocationsSizeAtSectionStart = sourceMapLocations.size();
  }
  binaryLocationsSizeAtSectionStart = binaryLocations.expressions.size();
  return writeU32LEBPlaceholder(); // section size to be filled in later
}